

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O3

void InternalSphere::Statistics
               (dgSphere *sphere,dgVector *eigenValues,dgVector *scaleVector,HaF32 *vertex,
               HaI32 *faceIndex,HaI32 indexCount,HaI32 stride)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  bool bVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  dgMatrix *initialGuess;
  long lVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [16];
  double dVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  
  auVar17 = in_ZMM22._0_16_;
  auVar16 = in_ZMM21._0_16_;
  if (indexCount < 1) {
    auVar15 = SUB6416(ZEXT864(0),0);
    auVar19 = ZEXT816(0);
    auVar14 = ZEXT816(0);
    auVar17 = vxorps_avx512vl(auVar17,auVar17);
    auVar34 = ZEXT816(0);
    auVar16 = vxorps_avx512vl(auVar16,auVar16);
  }
  else {
    fVar36 = (scaleVector->super_dgTemplateVector<float>).m_w;
    auVar41._8_4_ = 0x3eaaaaab;
    auVar41._0_8_ = 0x3eaaaaab3eaaaaab;
    auVar41._12_4_ = 0x3eaaaaab;
    fVar39 = (scaleVector->super_dgTemplateVector<float>).m_x;
    uVar1 = (scaleVector->super_dgTemplateVector<float>).m_y;
    uVar3 = (scaleVector->super_dgTemplateVector<float>).m_z;
    auVar37._4_4_ = uVar3;
    auVar37._0_4_ = uVar1;
    auVar37._8_8_ = 0;
    auVar14 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar15 = vpbroadcastd_avx512vl(ZEXT416(0x7f7fffff));
    lVar11 = (long)stride;
    auVar16 = vxorps_avx512vl(auVar16,auVar16);
    dVar38 = 0.0;
    auVar34 = ZEXT816(0);
    auVar17 = vxorps_avx512vl(auVar17,auVar17);
    auVar33 = ZEXT816(0);
    auVar35 = ZEXT864(0);
    lVar10 = 0;
    auVar19 = ZEXT816(0);
    do {
      auVar18 = auVar17;
      auVar8 = auVar16;
      auVar9 = auVar19;
      fVar40 = (float)*(ulong *)(vertex + faceIndex[lVar10] * lVar11 + 1);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(vertex + faceIndex[lVar10] * lVar11 + 1);
      auVar16 = vmovshdup_avx(auVar20);
      if ((((0x7f7fffff < (uint)ABS((float)vertex[faceIndex[lVar10] * lVar11])) ||
           (0x7f7fffff < (uint)ABS(fVar40))) || (NAN(fVar40))) ||
         ((0x7f7fffff < (uint)ABS(auVar16._0_4_) || (NAN(auVar16._0_4_))))) {
LAB_00856796:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x127,"dgVector::dgVector(const hacd::HaF32 *)");
      }
      auVar16 = vmulps_avx512vl(auVar20,auVar37);
      auVar17 = vmulss_avx512f(ZEXT416((uint)vertex[faceIndex[lVar10] * lVar11]),
                               ZEXT416((uint)fVar39));
      auVar19 = vmovshdup_avx512vl(auVar16);
      if (((0x7f7fffff < (auVar17._0_4_ & 0x7fffffff)) ||
          ((0x7f7fffff < (auVar16._0_4_ & 0x7fffffff) || (0x7f7fffff < (auVar19._0_4_ & 0x7fffffff))
           ))) || (0x7f7fffff < (uint)ABS(fVar36))) goto LAB_00856777;
      fVar40 = (float)*(ulong *)(vertex + faceIndex[lVar10 + 1] * lVar11 + 1);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(vertex + faceIndex[lVar10 + 1] * lVar11 + 1);
      auVar20 = vmovshdup_avx(auVar21);
      if ((((0x7f7fffff < (uint)ABS((float)vertex[faceIndex[lVar10 + 1] * lVar11])) ||
           (0x7f7fffff < (uint)ABS(fVar40))) || (NAN(fVar40))) ||
         ((0x7f7fffff < (uint)ABS(auVar20._0_4_) || (NAN(auVar20._0_4_))))) goto LAB_00856796;
      auVar20 = vmulps_avx512vl(auVar37,auVar21);
      auVar21 = vmulss_avx512f(ZEXT416((uint)fVar39),
                               ZEXT416((uint)vertex[faceIndex[lVar10 + 1] * lVar11]));
      auVar22 = vmovshdup_avx512vl(auVar20);
      if ((0x7f7fffff < (auVar21._0_4_ & 0x7fffffff)) ||
         ((0x7f7fffff < (auVar20._0_4_ & 0x7fffffff) || (0x7f7fffff < (auVar22._0_4_ & 0x7fffffff)))
         )) goto LAB_00856777;
      fVar40 = (float)*(ulong *)(vertex + faceIndex[lVar10 + 2] * lVar11 + 1);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(vertex + faceIndex[lVar10 + 2] * lVar11 + 1);
      auVar23 = vmovshdup_avx(auVar24);
      if (((0x7f7fffff < (uint)ABS((float)vertex[faceIndex[lVar10 + 2] * lVar11])) ||
          (((0x7f7fffff < (uint)ABS(fVar40) || (NAN(fVar40))) ||
           (0x7f7fffff < (uint)ABS(auVar23._0_4_))))) || (NAN(auVar23._0_4_))) goto LAB_00856796;
      auVar23 = vmulps_avx512vl(auVar37,auVar24);
      auVar24 = vmulss_avx512f(ZEXT416((uint)fVar39),
                               ZEXT416((uint)vertex[faceIndex[lVar10 + 2] * lVar11]));
      auVar25 = vmovshdup_avx512vl(auVar23);
      if (((0x7f7fffff < (auVar24._0_4_ & 0x7fffffff)) ||
          (0x7f7fffff < (auVar23._0_4_ & 0x7fffffff))) ||
         (0x7f7fffff < (auVar25._0_4_ & 0x7fffffff))) goto LAB_00856777;
      auVar26 = vsubss_avx512f(auVar22,auVar19);
      auVar27 = vsubss_avx512f(auVar23,auVar16);
      auVar28 = vsubss_avx512f(auVar21,auVar17);
      auVar29 = vsubss_avx512f(auVar20,auVar16);
      auVar30 = vsubss_avx512f(auVar25,auVar19);
      auVar31 = vsubss_avx512f(auVar24,auVar17);
      auVar32 = vmulss_avx512f(auVar27,auVar26);
      auVar32 = vfmsub231ss_fma(auVar32,auVar29,auVar30);
      auVar29 = vmulss_avx512f(auVar31,auVar29);
      auVar26 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar30._0_4_ * auVar28._0_4_)),auVar31,auVar26);
      auVar27 = vfmsub231ss_avx512f(auVar29,auVar28,auVar27);
      fVar40 = auVar26._0_4_;
      if (((0x7f7fffff < (auVar32._0_4_ & 0x7fffffff)) || (0x7f7fffff < (uint)ABS(fVar40))) ||
         (0x7f7fffff < (auVar27._0_4_ & 0x7fffffff))) goto LAB_00856777;
      auVar32 = vfmadd213ss_fma(auVar32,auVar32,ZEXT416((uint)(fVar40 * fVar40)));
      auVar32 = vfmadd213ss_fma(auVar27,auVar27,auVar32);
      auVar32 = vsqrtss_avx(auVar32,auVar32);
      auVar26 = vaddps_avx512vl(auVar16,auVar20);
      auVar26 = vaddps_avx512vl(auVar26,auVar23);
      uVar13 = vextractps_avx(auVar26,0);
      uVar12 = vextractps_avx(auVar26,1);
      fVar40 = auVar32._0_4_ * 0.5;
      auVar32 = vaddss_avx512f(auVar17,auVar21);
      auVar32 = vaddss_avx512f(auVar32,auVar24);
      if (((0x7f7fffff < (uint)ABS(auVar32._0_4_)) || (0x7f7fffff < (uVar13 & 0x7fffffff))) ||
         (0x7f7fffff < (uVar12 & 0x7fffffff))) goto LAB_00856777;
      auVar26 = vmulps_avx512vl(auVar26,auVar41);
      fVar5 = auVar32._0_4_ * 0.33333334;
      auVar32 = vmovshdup_avx512vl(auVar26);
      if (((0x7f7fffff < (uint)ABS(fVar5)) || (0x7f7fffff < (auVar26._0_4_ & 0x7fffffff))) ||
         (0x7f7fffff < (uint)ABS(auVar32._0_4_))) goto LAB_00856777;
      auVar27 = vmulss_avx512f(auVar21,auVar21);
      auVar21 = vbroadcastss_avx512vl(auVar21);
      auVar28 = vmulps_avx512vl(auVar20,auVar20);
      auVar21 = vmulps_avx512vl(auVar21,auVar20);
      auVar20 = vmulss_avx512f(auVar20,auVar22);
      auVar22 = vfmadd231ss_avx512f(auVar27,auVar17,auVar17);
      auVar17 = vbroadcastss_avx512vl(auVar17);
      auVar27 = vfmadd231ps_avx512vl(auVar28,auVar16,auVar16);
      auVar19 = vfmadd213ss_avx512f(auVar19,auVar16,auVar20);
      auVar16 = vfmadd213ps_avx512vl(auVar17,auVar16,auVar21);
      auVar17 = vbroadcastss_avx512vl(auVar24);
      auVar20 = vfmadd231ss_avx512f(auVar22,auVar24,auVar24);
      auVar21 = vfmadd231ps_avx512vl(auVar27,auVar23,auVar23);
      auVar19 = vfmadd213ss_avx512f(auVar25,auVar23,auVar19);
      auVar16 = vfmadd213ps_avx512vl(auVar17,auVar23,auVar16);
      if (fVar40 <= 0.0001) {
        auVar22 = vinsertps_avx512f(ZEXT416((uint)fVar5),auVar26,0x1c);
        auVar17 = vpermt2ps_avx512vl(auVar26,_DAT_009d86b0,ZEXT416((uint)fVar36));
      }
      else {
        auVar22 = vmulss_avx512f(auVar26,ZEXT416((uint)fVar40));
        auVar23 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar40));
        fVar6 = auVar32._0_4_ * fVar40;
        if (((0x7f7fffff < (auVar23._0_4_ & 0x7fffffff)) ||
            (0x7f7fffff < (auVar22._0_4_ & 0x7fffffff))) || (0x7f7fffff < (uint)ABS(fVar6)))
        goto LAB_00856777;
        auVar24 = vcvtps2pd_avx512vl(auVar26);
        auVar17 = vinsertps_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar36),0x10);
        auVar27._0_8_ = (double)fVar40 / 12.0;
        auVar27._8_8_ = 0;
        auVar22 = vinsertps_avx512f(auVar23,auVar22,0x10);
        auVar28._0_8_ = (double)fVar5;
        auVar28._8_8_ = 0;
        auVar25 = vmulsd_avx512f(auVar28,ZEXT816(0x4022000000000000));
        auVar23._12_4_ = 0x40220000;
        auVar23._0_12_ = ZEXT812(0x4022000000000000);
        auVar23 = vmulpd_avx512vl(auVar24,auVar23);
        auVar21 = vcvtps2pd_avx512vl(auVar21);
        auVar16 = vcvtps2pd_avx512vl(auVar16);
        auVar19 = vcvtss2sd_avx512f(auVar19,auVar19);
        auVar32 = vshufpd_avx512vl(auVar24,auVar24,1);
        auVar26 = vmovddup_avx512vl(auVar25);
        auVar21 = vfmadd231pd_avx512vl(auVar21,auVar23,auVar24);
        auVar19 = vfmadd213sd_avx512f(auVar32,auVar23,auVar19);
        auVar16 = vfmadd213pd_avx512vl(auVar26,auVar24,auVar16);
        auVar23 = vmovddup_avx512vl(auVar27);
        auVar19 = vmulsd_avx512f(auVar19,auVar27);
        auVar21 = vmulpd_avx512vl(auVar21,auVar23);
        auVar16 = vmulpd_avx512vl(auVar16,auVar23);
        auVar20 = vcvtss2sd_avx512f(auVar20,auVar20);
        auVar19 = vcvtsd2ss_avx512f(auVar19,auVar19);
        auVar20 = vfmadd231sd_avx512f(auVar20,auVar25,auVar28);
        auVar21 = vcvtpd2ps_avx512vl(auVar21);
        auVar20 = vmulsd_avx512f(auVar20,auVar27);
        auVar16 = vcvtpd2ps_avx512vl(auVar16);
        auVar20 = vcvtsd2ss_avx512f(auVar20,auVar20);
      }
      auVar23 = vmovshdup_avx512vl(auVar21);
      bVar4 = 0x7f7fffff < (uint)ABS(auVar23._0_4_);
      if ((((NAN(auVar23._0_4_)) || (bVar4)) || (auVar23 = vucomiss_avx512f(auVar21), !bVar4)) ||
         ((0x7f7fffff < (auVar21._0_4_ & 0x7fffffff) || (0x7f7fffff < (auVar20._0_4_ & 0x7fffffff)))
         )) goto LAB_008567b5;
      uVar12 = auVar19._0_4_ & 0x7fffffff;
      auVar21 = vucomiss_avx512f(auVar19);
      if (((POPCOUNT(uVar12 + 0x80800000 & 0xff) & 1U) == 0) ||
         ((0x7f7fffff < uVar12 || (auVar19 = vmovshdup_avx512vl(auVar16), NAN(auVar19._0_4_)))))
      goto LAB_008567b5;
      auVar19 = vandps_avx512vl(auVar16,auVar14);
      uVar7 = vpcmpgtd_avx512vl(auVar19,auVar15);
      if ((((uVar7 & 0xf) >> 1 & 1) != 0) || ((uVar7 & 1) != 0)) goto LAB_008567b5;
      auVar19 = vpermt2ps_avx512vl(auVar8,_DAT_009e2040,auVar34);
      auVar24 = vaddps_avx512vl(auVar9,auVar17);
      auVar20 = vaddss_avx512f(auVar34,auVar20);
      dVar38 = dVar38 + (double)fVar40;
      auVar33 = vaddps_avx512vl(auVar33,auVar16);
      auVar22 = vaddps_avx512vl(auVar35._0_16_,auVar22);
      auVar35 = ZEXT1664(auVar22);
      auVar17 = vaddss_avx512f(auVar18,auVar21);
      lVar10 = lVar10 + 3;
      auVar23 = vaddps_avx512vl(auVar19,auVar23);
      auVar19 = vblendps_avx(auVar24,auVar9,2);
      auVar16 = vinsertps_avx512f(auVar8,auVar23,0x4c);
      auVar34 = vinsertps_avx(auVar20,auVar23,0x1c);
    } while ((int)lVar10 < indexCount);
    auVar14 = auVar33;
    auVar15 = auVar22;
    if (9.999999747378752e-05 < dVar38) {
      fVar39 = (float)(1.0 / dVar38);
      auVar25._0_4_ = auVar23._0_4_ * fVar39;
      auVar25._4_4_ = auVar23._4_4_ * fVar39;
      auVar25._8_4_ = auVar23._8_4_ * fVar39;
      auVar25._12_4_ = auVar23._12_4_ * fVar39;
      auVar37 = ZEXT416((uint)(auVar20._0_4_ * fVar39));
      auVar34 = vpermt2ps_avx512vl(auVar8,_DAT_009e2050,auVar37);
      auVar14 = vpermi2ps_avx512vl(_DAT_009d8070,auVar34,auVar25);
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar34 = vandps_avx512vl(auVar14,auVar34);
      auVar8._8_4_ = 0x7f7fffff;
      auVar8._0_8_ = 0x7f7fffff7f7fffff;
      auVar8._12_4_ = 0x7f7fffff;
      uVar7 = vpcmpgtd_avx512vl(auVar34,auVar8);
      if ((uVar7 & 0xf) == 0) {
        auVar34 = vaddss_avx512f(auVar18,auVar21);
        auVar14._0_4_ = auVar33._0_4_ * fVar39;
        auVar14._4_4_ = auVar33._4_4_ * fVar39;
        auVar14._8_4_ = auVar33._8_4_ * fVar39;
        auVar14._12_4_ = auVar33._12_4_ * fVar39;
        fVar36 = auVar34._0_4_ * fVar39;
        auVar34 = vmovlhps_avx(auVar14,auVar18);
        auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)fVar36),0x20);
        auVar33._8_4_ = 0x7fffffff;
        auVar33._0_8_ = 0x7fffffff7fffffff;
        auVar33._12_4_ = 0x7fffffff;
        auVar34 = vandps_avx512vl(auVar34,auVar33);
        auVar18._8_4_ = 0x7f7fffff;
        auVar18._0_8_ = 0x7f7fffff7f7fffff;
        auVar18._12_4_ = 0x7f7fffff;
        uVar7 = vpcmpgtd_avx512vl(auVar34,auVar18);
        if ((uVar7 & 0xf) == 0) {
          auVar15._0_4_ = auVar22._0_4_ * fVar39;
          auVar15._4_4_ = auVar22._4_4_ * fVar39;
          auVar15._8_4_ = auVar22._8_4_ * fVar39;
          auVar15._12_4_ = auVar22._12_4_ * fVar39;
          fVar39 = auVar24._0_4_ * fVar39;
          auVar34 = vmovlhps_avx(auVar15,auVar9);
          auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)fVar39),0x20);
          auVar9._8_4_ = 0x7fffffff;
          auVar9._0_8_ = 0x7fffffff7fffffff;
          auVar9._12_4_ = 0x7fffffff;
          auVar34 = vandps_avx512vl(auVar34,auVar9);
          auVar22._8_4_ = 0x7f7fffff;
          auVar22._0_8_ = 0x7f7fffff7f7fffff;
          auVar22._12_4_ = 0x7f7fffff;
          uVar7 = vpcmpgtd_avx512vl(auVar34,auVar22);
          if ((uVar7 & 0xf) == 0) {
            auVar34 = vinsertps_avx(auVar37,auVar25,0x1c);
            auVar16 = vinsertps_avx512f(auVar16,auVar25,0x4c);
            auVar17._0_4_ = fVar36;
            auVar19._4_12_ = auVar19._4_12_;
            auVar19._0_4_ = fVar39;
            goto LAB_00856641;
          }
        }
      }
LAB_00856777:
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
    }
  }
LAB_00856641:
  auVar37 = vfnmadd213ss_fma(auVar15,auVar15,auVar34);
  auVar34 = vblendps_avx(auVar14,auVar34,2);
  auVar33 = vmovshdup_avx(auVar15);
  auVar14 = vmovshdup_avx(auVar14);
  auVar34 = vfnmadd231ps_fma(auVar34,auVar15,auVar33);
  auVar14 = vfnmadd231ss_fma(auVar14,auVar19,auVar15);
  fVar36 = auVar34._0_4_;
  fVar39 = auVar14._0_4_;
  if ((((!NAN(fVar39)) && ((uint)ABS(fVar39) < 0x7f800000)) && (!NAN(fVar36))) &&
     (((uint)ABS(fVar36) < 0x7f800000 && ((uint)ABS(auVar37._0_4_) < 0x7f800000)))) {
    auVar17 = vfnmadd213ss_avx512f(auVar33,auVar19,auVar17);
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x = auVar37._0_4_;
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar36;
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar39;
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = 0.0;
    fVar36 = auVar17._0_4_;
    if (!NAN(fVar36)) {
      auVar29._4_12_ = auVar34._4_12_;
      auVar29._0_4_ = fVar36;
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl(auVar29,auVar32);
      auVar26._8_4_ = 0x7f7fffff;
      auVar26._0_8_ = 0x7f7fffff7f7fffff;
      auVar26._12_4_ = 0x7f7fffff;
      uVar7 = vpcmpgtd_avx512vl(auVar17,auVar26);
      if (((uVar7 & 1) == 0) && (((uVar7 & 0xf) >> 1 & 1) == 0)) {
        auVar16 = vfnmadd213ss_avx512f(auVar19,auVar19,auVar16);
        uVar2 = vmovlpd_avx(auVar34);
        (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = (float)(int)uVar2;
        (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar36;
        (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = 0.0;
        if ((uint)ABS(auVar16._0_4_) < 0x7f800000) {
          (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = fVar39;
          (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar36;
          (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = auVar16._0_4_;
          (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = 0.0;
          initialGuess = dgGetIdentityMatrix();
          dgMatrix::EigenVectors(&sphere->super_dgMatrix,eigenValues,initialGuess);
          return;
        }
      }
    }
  }
LAB_008567b5:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

static void Statistics (dgSphere &sphere, dgVector &eigenValues, dgVector &scaleVector, const hacd::HaF32 vertex[], const hacd::HaI32 faceIndex[], hacd::HaI32 indexCount, hacd::HaI32 stride)
	{
		dgVector var (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector cov (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector centre (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector massCenter (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));

		hacd::HaF64 totalArea = hacd::HaF32 (0.0f);
		const hacd::HaF32* const ptr = vertex;
		for (hacd::HaI32 i = 0; i < indexCount; i += 3) {
			hacd::HaI32 index = faceIndex[i] * stride;
			dgVector p0 (&ptr[index]);
			p0 = p0.CompProduct (scaleVector);

			index = faceIndex[i + 1] * stride;;
			dgVector p1 (&ptr[index]);
			p1 = p1.CompProduct (scaleVector);

			index = faceIndex[i + 2] * stride;;
			dgVector p2 (&ptr[index]);
			p2 = p2.CompProduct (scaleVector);

			dgVector normal ((p1 - p0) * (p2 - p0));

			hacd::HaF64 area = hacd::HaF32 (0.5f) * sqrt (normal % normal);

			centre = p0 + p1 + p2;
			centre = centre.Scale (hacd::HaF32  (1.0f / 3.0f));

			// Inertia of each point in the triangle
			hacd::HaF64 Ixx = p0.m_x * p0.m_x + p1.m_x * p1.m_x + p2.m_x * p2.m_x;	
			hacd::HaF64 Iyy = p0.m_y * p0.m_y + p1.m_y * p1.m_y + p2.m_y * p2.m_y;	
			hacd::HaF64 Izz = p0.m_z * p0.m_z + p1.m_z * p1.m_z + p2.m_z * p2.m_z;	

			hacd::HaF64 Ixy = p0.m_x * p0.m_y + p1.m_x * p1.m_y + p2.m_x * p2.m_y;	
			hacd::HaF64 Iyz = p0.m_y * p0.m_z + p1.m_y * p1.m_z + p2.m_y * p2.m_z;	
			hacd::HaF64 Ixz = p0.m_x * p0.m_z + p1.m_x * p1.m_z + p2.m_x * p2.m_z;	

			if (area > dgEPSILON * 10.0) {
				hacd::HaF64 K = area / hacd::HaF64 (12.0);
				//Coriolis theorem for Inertia of a triangle in an arbitrary orientation
				Ixx = K * (Ixx + 9.0 * centre.m_x * centre.m_x);
				Iyy = K * (Iyy + 9.0 * centre.m_y * centre.m_y);
				Izz = K * (Izz + 9.0 * centre.m_z * centre.m_z);

				Ixy = K * (Ixy + 9.0 * centre.m_x * centre.m_y);
				Ixz = K * (Ixz + 9.0 * centre.m_x * centre.m_z);
				Iyz = K * (Iyz + 9.0 * centre.m_y * centre.m_z);
				centre = centre.Scale ((hacd::HaF32)area);
			} 

			totalArea += area;
			massCenter += centre;
			var += dgVector ((hacd::HaF32)Ixx, (hacd::HaF32)Iyy, (hacd::HaF32)Izz, hacd::HaF32 (0.0f));
			cov += dgVector ((hacd::HaF32)Ixy, (hacd::HaF32)Ixz, (hacd::HaF32)Iyz, hacd::HaF32 (0.0f));
		}

		if (totalArea > dgEPSILON * 10.0) {
			hacd::HaF64 K = hacd::HaF64 (1.0) / totalArea; 
			var = var.Scale ((hacd::HaF32)K);
			cov = cov.Scale ((hacd::HaF32)K);
			massCenter = massCenter.Scale ((hacd::HaF32)K);
		}

		hacd::HaF64 Ixx = var.m_x - massCenter.m_x * massCenter.m_x;
		hacd::HaF64 Iyy = var.m_y - massCenter.m_y * massCenter.m_y;
		hacd::HaF64 Izz = var.m_z - massCenter.m_z * massCenter.m_z;

		hacd::HaF64 Ixy = cov.m_x - massCenter.m_x * massCenter.m_y;
		hacd::HaF64 Ixz = cov.m_y - massCenter.m_x * massCenter.m_z;
		hacd::HaF64 Iyz = cov.m_z - massCenter.m_y * massCenter.m_z;

		sphere.m_front = dgVector ((hacd::HaF32)Ixx, (hacd::HaF32)Ixy, (hacd::HaF32)Ixz, hacd::HaF32 (0.0f));
		sphere.m_up    = dgVector ((hacd::HaF32)Ixy, (hacd::HaF32)Iyy, (hacd::HaF32)Iyz, hacd::HaF32 (0.0f));
		sphere.m_right = dgVector ((hacd::HaF32)Ixz, (hacd::HaF32)Iyz, (hacd::HaF32)Izz, hacd::HaF32 (0.0f));
		sphere.EigenVectors(eigenValues);
	}